

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcPrsNode * __thiscall CTPNMemArgBase::fold_constants(CTPNMemArgBase *this,CTcPrsSymtab *symtab)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  iVar1 = (*(this->obj_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])();
  this->obj_expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*(this->prop_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0xf])
                    (this->prop_expr_,symtab);
  this->prop_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar1);
  (*(this->arglist_->super_CTPNArglistBase).super_CTcPrsNode.super_CTcPrsNodeBase.
    _vptr_CTcPrsNodeBase[0xf])(this->arglist_,symtab);
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNMemArgBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold constants in the object and property expressions */
    obj_expr_ = obj_expr_->fold_constants(symtab);
    prop_expr_ = prop_expr_->fold_constants(symtab);

    /* 
     *   fold constants in the argument list; an argument list node never
     *   changes to a new node type during constant folding, so we don't
     *   need to update the member 
     */
    arglist_->fold_constants(symtab);

    /* return myself with no further evaluation */
    return this;
}